

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool P_Move(AActor *actor)

{
  sector_t *sec;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ASectorAction *this;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double z;
  bool local_3bf;
  bool local_3bd;
  bool local_3b6;
  byte local_389;
  bool local_2f8;
  Self local_2f4;
  TFlags<ActorFlag2,_unsigned_int> local_2f0;
  TFlags<ActorFlag4,_unsigned_int> local_2ec;
  TFlags<ActorFlag6,_unsigned_int> local_2e8;
  uint local_2e4;
  undefined1 auStack_2e0 [4];
  int good;
  spechit_t spec;
  double savedz_1;
  DVector3 local_2a0;
  TVector2<double> local_288;
  double local_278;
  double savedz;
  TFlags<ActorFlag6,_unsigned_int> local_268;
  TFlags<ActorFlag,_unsigned_int> local_264;
  TVector2<double> local_260;
  TVector2<double> local_250;
  DVector3 local_240;
  TVector3<double> local_228;
  TVector2<double> local_210;
  TAngle<double> local_200;
  TVector2<double> local_1f8;
  TAngle<double> local_1e8;
  DAngle anglediff;
  undefined1 local_1c8 [32];
  TVector2<double> local_1a8;
  undefined1 local_198 [8];
  DVector2 ptry;
  int i;
  DAngle oldangle;
  DVector2 move;
  undefined1 local_158 [8];
  DVector2 start;
  FCheckPosition tm;
  double yspeed;
  double xspeed;
  int steps;
  double maxmove;
  AActor *local_88;
  AActor *target;
  TFlags<ActorFlag6,_unsigned_int> local_78;
  TFlags<ActorFlag,_unsigned_int> local_74;
  TFlags<ActorFlag2,_unsigned_int> local_70;
  int local_6c;
  double dStack_68;
  int dropoff;
  double friction;
  double movefactor;
  double speed;
  double dStack_48;
  bool try_ok;
  double origy;
  double origx;
  double deltay;
  double deltax;
  double tryy;
  double tryx;
  AActor *actor_local;
  
  movefactor = actor->Speed;
  friction = 0.03125;
  dStack_68 = 0.90625;
  local_6c = 0;
  tryx = (double)actor;
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_70,(int)actor + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
  if (uVar2 != 0) {
    actor_local._7_1_ = 1;
    goto LAB_0054e689;
  }
  if (*(char *)((long)tryx + 0x200) == '\b') {
    actor_local._7_1_ = 0;
    goto LAB_0054e689;
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_74,
             SUB84(tryx,0) +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
  bVar4 = false;
  if (uVar2 == 0) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_78,
               SUB84(tryx,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_78);
    bVar4 = false;
    if (uVar2 == 0) {
      dVar5 = AActor::Z((AActor *)tryx);
      bVar4 = false;
      if (*(double *)((long)tryx + 0x140) <= dVar5 && dVar5 != *(double *)((long)tryx + 0x140)) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)((long)&target + 4),
                   SUB84(tryx,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&target + 4));
        bVar4 = uVar2 == 0;
      }
    }
  }
  if (bVar4) {
    actor_local._7_1_ = 0;
    goto LAB_0054e689;
  }
  if (7 < *(byte *)((long)tryx + 0x200)) {
    I_Error("Weird actor->movedir!");
  }
  local_88 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)tryx + 0x208));
  TFlags<ActorFlag6,_unsigned_int>::operator&
            ((TFlags<ActorFlag6,_unsigned_int> *)((long)&maxmove + 4),
             SUB84(tryx,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&maxmove + 4));
  bVar4 = false;
  if ((uVar2 != 0) && (bVar4 = false, local_88 != (AActor *)0x0)) {
    bVar1 = AActor::IsFriend(local_88,(AActor *)tryx);
    bVar4 = false;
    if (!bVar1) {
      dVar5 = AActor::Distance2D((AActor *)tryx,local_88,false);
      bVar4 = false;
      if (dVar5 < 144.0) {
        iVar3 = FRandom::operator()(&pr_dropoff);
        bVar4 = iVar3 < 0xeb;
      }
    }
  }
  if (bVar4) {
    local_6c = 2;
  }
  uVar2 = FIntCVar::operator_cast_to_int(&compatflags);
  if (((uVar2 & 0x1000000) != 0) &&
     (friction = P_GetMoveFactor((AActor *)tryx,&stack0xffffffffffffff98), dStack_68 < 0.90625)) {
    movefactor = (movefactor * (0.03125 - (0.03125 - friction) / 2.0)) / 0.03125;
    if ((movefactor == 0.0) && (!NAN(movefactor))) {
      movefactor = *(double *)((long)tryx + 0xe0);
    }
  }
  origy = AActor::X((AActor *)tryx);
  deltay = movefactor * ::xspeed[*(byte *)((long)tryx + 0x200)];
  tryy = origy + deltay;
  dStack_48 = AActor::Y((AActor *)tryx);
  origx = movefactor * ::yspeed[*(byte *)((long)tryx + 0x200)];
  deltax = dStack_48 + origx;
  dVar5 = *(double *)((long)tryx + 0x178) - 1.0;
  xspeed._4_4_ = 1;
  if (0.0 < dVar5) {
    dVar6 = ABS(deltay);
    dVar7 = ABS(origx);
    if (dVar6 <= dVar7) {
      if (dVar5 < dVar7) {
        xspeed._4_4_ = (int)(dVar7 / dVar5) + 1;
      }
    }
    else if (dVar5 < dVar6) {
      xspeed._4_4_ = (int)(dVar6 / dVar5) + 1;
    }
  }
  FCheckPosition::FCheckPosition((FCheckPosition *)&start.Y,false);
  TVector2<double>::TVector2((TVector2<double> *)local_158,origy,dStack_48);
  TVector2<double>::TVector2((TVector2<double> *)&oldangle,deltay,origx);
  TAngle<double>::TAngle
            ((TAngle<double> *)&stack0xfffffffffffffe80,(TAngle<double> *)((long)tryx + 0xb0));
  speed._7_1_ = 1;
  for (ptry.Y._4_4_ = 1; ptry.Y._4_4_ <= xspeed._4_4_; ptry.Y._4_4_ = ptry.Y._4_4_ + 1) {
    operator*((TVector2<double> *)(local_1c8 + 0x10),(double)ptry.Y._4_4_);
    TVector2<double>::operator/(&local_1a8,(double)xspeed._4_4_);
    TVector2<double>::operator+((TVector2<double> *)local_198,(TVector2<double> *)local_158);
    speed._7_1_ = P_TryMove((AActor *)tryx,(DVector2 *)local_198,local_6c,(secplane_t *)0x0,
                            (FCheckPosition *)&start.Y,false);
    if (!(bool)speed._7_1_) break;
    local_2f8 = false;
    if (1 < xspeed._4_4_) {
      AActor::Pos((DVector3 *)&anglediff,(AActor *)tryx);
      TVector3<double>::XY((TVector3<double> *)local_1c8);
      local_2f8 = TVector2<double>::operator!=
                            ((TVector2<double> *)local_1c8,(TVector2<double> *)local_198);
    }
    if (local_2f8 != false) {
      deltaangle<double>(&local_1e8,(TAngle<double> *)&stack0xfffffffffffffe80);
      bVar4 = TAngle<double>::operator!=(&local_1e8,0.0);
      if (bVar4) {
        TAngle<double>::TAngle(&local_200,&local_1e8);
        TVector2<double>::Rotated<double>(&local_1f8,&oldangle);
        TVector2<double>::operator=((TVector2<double> *)&oldangle,&local_1f8);
        TAngle<double>::operator=
                  ((TAngle<double> *)&stack0xfffffffffffffe80,(TAngle<double> *)((long)tryx + 0xb0))
        ;
      }
      AActor::Pos(&local_240,(AActor *)tryx);
      operator*(&local_260,(double)ptry.Y._4_4_);
      TVector2<double>::operator/(&local_250,(double)xspeed._4_4_);
      operator-(&local_228,&local_240,&local_250);
      TVector2<double>::TVector2(&local_210,&local_228);
      TVector2<double>::operator=((TVector2<double> *)local_158,&local_210);
    }
  }
  bVar4 = FBoolCVar::operator_cast_to_bool(&nomonsterinterpolation);
  if (bVar4) {
    AActor::ClearInterpolation((AActor *)tryx);
  }
  dVar7 = tryx;
  dVar6 = origy;
  dVar5 = dStack_48;
  if (((speed._7_1_ & 1) != 0) && (0.90625 < dStack_68)) {
    z = AActor::Z((AActor *)tryx);
    AActor::SetOrigin((AActor *)dVar7,dVar6,dVar5,z,false);
    friction = friction * 8.0;
    *(double *)((long)tryx + 200) = deltay * friction + *(double *)((long)tryx + 200);
    *(double *)((long)tryx + 0xd0) = origx * friction + *(double *)((long)tryx + 0xd0);
  }
  bVar4 = false;
  if ((speed._7_1_ & 1) != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_264,
               SUB84(tryx,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_264);
    bVar4 = false;
    if (uVar2 == 0) {
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_268,
                 SUB84(tryx,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_268);
      bVar4 = false;
      if (uVar2 == 0) {
        dVar5 = AActor::Z((AActor *)tryx);
        bVar4 = false;
        if (*(double *)((long)tryx + 0x140) <= dVar5 && dVar5 != *(double *)((long)tryx + 0x140)) {
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    ((TFlags<ActorFlag2,_unsigned_int> *)((long)&savedz + 4),
                     SUB84(tryx,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&savedz + 4));
          bVar4 = uVar2 == 0;
        }
      }
    }
  }
  if ((bVar4) &&
     (dVar5 = AActor::Z((AActor *)tryx),
     dVar5 <= *(double *)((long)tryx + 0x140) + *(double *)((long)tryx + 0x3f0))) {
    local_278 = AActor::Z((AActor *)tryx);
    AActor::SetZ((AActor *)tryx,*(double *)((long)tryx + 0x140),true);
    bVar4 = P_TestMobjZ((AActor *)tryx,true,(AActor **)0x0);
    if (bVar4) {
      bVar1 = TObjPtr<ASectorAction>::operator!=
                        ((TObjPtr<ASectorAction> *)(*(long *)((long)tryx + 0x158) + 0x1f8),
                         (ASectorAction *)0x0);
      bVar4 = false;
      if (bVar1) {
        dVar5 = *(double *)((long)tryx + 0x140);
        sec = *(sector_t **)((long)tryx + 0x158);
        AActor::PosRelative(&local_2a0,(AActor *)tryx,sec);
        TVector2<double>::TVector2(&local_288,&local_2a0);
        dVar6 = secplane_t::ZatPoint(&sec->floorplane,&local_288);
        bVar4 = dVar5 == dVar6;
      }
      if (bVar4) {
        this = TObjPtr<ASectorAction>::operator->
                         ((TObjPtr<ASectorAction> *)(*(long *)((long)tryx + 0x158) + 0x1f8));
        ASectorAction::TriggerAction(this,(AActor *)tryx,4);
      }
      dVar5 = tryx;
      dVar6 = AActor::Z((AActor *)tryx);
      P_CheckFor3DFloorHit((AActor *)dVar5,dVar6);
    }
    else {
      AActor::SetZ((AActor *)tryx,local_278,true);
    }
  }
  if ((speed._7_1_ & 1) == 0) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              ((TFlags<ActorFlag6,_unsigned_int> *)((long)&savedz_1 + 4),
               SUB84(tryx,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&savedz_1 + 4));
    if (uVar2 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&savedz_1,
                 SUB84(tryx,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&savedz_1);
      local_389 = 0;
      if (uVar2 != 0) goto LAB_0054e2b7;
    }
    else {
LAB_0054e2b7:
      local_389 = tm.ceilingsector._2_1_;
    }
    if ((local_389 & 1) != 0) {
      dVar5 = AActor::Z((AActor *)tryx);
      dVar6 = AActor::Z((AActor *)tryx);
      if ((double)tm.sector <= dVar6) {
        AActor::AddZ((AActor *)tryx,-*(double *)((long)tryx + 0xe8),true);
      }
      else {
        AActor::AddZ((AActor *)tryx,*(double *)((long)tryx + 0xe8),true);
      }
      bVar4 = P_TestMobjZ((AActor *)tryx,true,(AActor **)0x0);
      if (bVar4) {
        TFlags<ActorFlag,_unsigned_int>::operator|=
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)tryx + 0x1bc),MF_INBOUNCE);
        actor_local._7_1_ = true;
        goto LAB_0054e67d;
      }
      AActor::SetZ((AActor *)tryx,dVar5,true);
    }
    uVar2 = TArray<spechit_t,_spechit_t>::Size(&spechit);
    if (uVar2 == 0) {
      actor_local._7_1_ = false;
    }
    else {
      *(undefined1 *)((long)tryx + 0x200) = 8;
      spechit_t::spechit_t((spechit_t *)auStack_2e0);
      local_2e4 = 0;
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_2e8,
                 SUB84(tryx,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2e8);
      if (uVar2 == 0) {
        while (bVar4 = TArray<spechit_t,_spechit_t>::Pop(&spechit,(spechit_t *)auStack_2e0), bVar4)
        {
          TFlags<ActorFlag4,_unsigned_int>::operator&
                    (&local_2ec,
                     SUB84(tryx,0) +
                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2ec);
          if (uVar2 == 0) {
LAB_0054e509:
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_2f0,SUB84(tryx,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2f0);
            local_3bd = false;
            if (uVar2 != 0) {
              local_3bd = P_ActivateLine(_auStack_2e0,(AActor *)tryx,0,0x10,(DVector3 *)0x0);
            }
            local_3b6 = local_3bd;
          }
          else {
            bVar4 = P_ActivateLine(_auStack_2e0,(AActor *)tryx,0,2,(DVector3 *)0x0);
            local_3b6 = true;
            if (!bVar4) goto LAB_0054e509;
          }
          if (local_3b6 != false) {
            uVar2 = 2;
            if (_auStack_2e0 == *(line_t_conflict **)((long)tryx + 0x358)) {
              uVar2 = 1;
            }
            local_2e4 = uVar2 | local_2e4;
          }
        }
      }
      else {
        TArray<spechit_t,_spechit_t>::Clear(&spechit);
      }
      local_3bf = false;
      if (local_2e4 != 0) {
        iVar3 = FRandom::operator()(&pr_opendoor);
        local_3bf = (uint)(0xca < iVar3) != (local_2e4 & 1);
      }
      actor_local._7_1_ = local_3bf;
    }
  }
  else {
    operator~((EnumType)&local_2f4);
    TFlags<ActorFlag,_unsigned_int>::operator&=
              ((TFlags<ActorFlag,_unsigned_int> *)((long)tryx + 0x1bc),&local_2f4);
    actor_local._7_1_ = true;
  }
LAB_0054e67d:
  spec.Refpos.Y._4_4_ = 1;
  FCheckPosition::~FCheckPosition((FCheckPosition *)&start.Y);
LAB_0054e689:
  return (bool)(actor_local._7_1_ & 1);
}

Assistant:

bool P_Move (AActor *actor)
{

	double tryx, tryy, deltax, deltay, origx, origy;
	bool try_ok;
	double speed = actor->Speed;
	double movefactor = ORIG_FRICTION_FACTOR;
	double friction = ORIG_FRICTION;
	int dropoff = 0;

	if (actor->flags2 & MF2_BLASTED)
	{
		return true;
	}

	if (actor->movedir == DI_NODIR)
	{
		return false;
	}

	// [RH] Walking actors that are not on the ground cannot walk. We don't
	// want to yank them to the ground here as Doom did, since that makes
	// it difficult to thrust them vertically in a reasonable manner.
	// [GZ] Let jumping actors jump.
	if (!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
		&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		return false;
	}

	if ((unsigned)actor->movedir >= 8)
		I_Error ("Weird actor->movedir!");

	// killough 10/98: allow dogs to drop off of taller ledges sometimes.
	// dropoff==1 means always allow it, dropoff==2 means only up to 128 high,
	// and only if the target is immediately on the other side of the line.
	AActor *target = actor->target;

	if ((actor->flags6 & MF6_JUMPDOWN) && target &&
			!(target->IsFriend(actor)) &&
			actor->Distance2D(target) < 144 &&
			pr_dropoff() < 235)
	{
		dropoff = 2;
	}

	// [RH] I'm not so sure this is such a good idea
	// [GZ] That's why it's compat-optioned.
	if (compatflags & COMPATF_MBFMONSTERMOVE)
	{
		// killough 10/98: make monsters get affected by ice and sludge too:
		movefactor = P_GetMoveFactor (actor, &friction);

		if (friction < ORIG_FRICTION)
		{ // sludge
			speed = speed * ((ORIG_FRICTION_FACTOR - (ORIG_FRICTION_FACTOR-movefactor)/2)) / ORIG_FRICTION_FACTOR;
			if (speed == 0)
			{ // always give the monster a little bit of speed
				speed = actor->Speed;
			}
		}
	}

	tryx = (origx = actor->X()) + (deltax = (speed * xspeed[actor->movedir]));
	tryy = (origy = actor->Y()) + (deltay = (speed * yspeed[actor->movedir]));

	// Like P_XYMovement this should do multiple moves if the step size is too large

	double maxmove = actor->radius - 1;
	int steps = 1;

	if (maxmove > 0)
	{ 
		const double xspeed = fabs (deltax);
		const double yspeed = fabs (deltay);

		if (xspeed > yspeed)
		{
			if (xspeed > maxmove)
			{
				steps = 1 + int(xspeed / maxmove);
			}
		}
		else
		{
			if (yspeed > maxmove)
			{
				steps = 1 + int(yspeed / maxmove);
			}
		}
	}
	FCheckPosition tm;

	tm.FromPMove = true;

	DVector2 start = { origx, origy };
	DVector2 move = { deltax, deltay };
	DAngle oldangle = actor->Angles.Yaw;

	try_ok = true;
	for (int i = 1; i <= steps; i++)
	{
		DVector2 ptry = start + move * i / steps;
		// killough 3/15/98: don't jump over dropoffs:
		try_ok = P_TryMove(actor, ptry, dropoff, NULL, tm);
		if (!try_ok) break;

		// Handle portal transitions just like P_XYMovement.
		if (steps > 1 && actor->Pos().XY() != ptry)
		{
			DAngle anglediff = deltaangle(oldangle, actor->Angles.Yaw);

			if (anglediff != 0)
			{
				move = move.Rotated(anglediff);
				oldangle = actor->Angles.Yaw;
			}
			start = actor->Pos() - move * i / steps;
		}
	}

	// [GrafZahl] Interpolating monster movement as it is done here just looks bad
	// so make it switchable
	if (nomonsterinterpolation)
	{
		actor->ClearInterpolation();
	}

	if (try_ok && friction > ORIG_FRICTION)
	{
		actor->SetOrigin(origx, origy, actor->Z(), false);
		movefactor *= 1.f / ORIG_FRICTION_FACTOR / 4;
		actor->Vel.X += deltax * movefactor;
		actor->Vel.Y += deltay * movefactor;
	}

	// [RH] If a walking monster is no longer on the floor, move it down
	// to the floor if it is within MaxStepHeight, presuming that it is
	// actually walking down a step.
	if (try_ok &&
		!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
			&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		if (actor->Z() <= actor->floorz + actor->MaxStepHeight)
		{
			double savedz = actor->Z();
			actor->SetZ(actor->floorz);
			// Make sure that there isn't some other actor between us and
			// the floor we could get stuck in. The old code did not do this.
			if (!P_TestMobjZ(actor))
			{
				actor->SetZ(savedz);
			}
			else
			{ // The monster just hit the floor, so trigger any actions.
				if (actor->floorsector->SecActTarget != NULL &&
					actor->floorz == actor->floorsector->floorplane.ZatPoint(actor->PosRelative(actor->floorsector)))
				{
					actor->floorsector->SecActTarget->TriggerAction(actor, SECSPAC_HitFloor);
				}
				P_CheckFor3DFloorHit(actor, actor->Z());
			}
		}
	}

	if (!try_ok)
	{
		if (((actor->flags6 & MF6_CANJUMP)||(actor->flags & MF_FLOAT)) && tm.floatok)
		{ // must adjust height
			double savedz = actor->Z();

			if (actor->Z() < tm.floorz)
				actor->AddZ(actor->FloatSpeed);
			else
				actor->AddZ(-actor->FloatSpeed);


			// [RH] Check to make sure there's nothing in the way of the float
			if (P_TestMobjZ (actor))
			{
				actor->flags |= MF_INFLOAT;
				return true;
			}
			actor->SetZ(savedz);
		}

		if (!spechit.Size ())
		{
			return false;
		}

		// open any specials
		actor->movedir = DI_NODIR;

		// if the special is not a door that can be opened, return false
		//
		// killough 8/9/98: this is what caused monsters to get stuck in
		// doortracks, because it thought that the monster freed itself
		// by opening a door, even if it was moving towards the doortrack,
		// and not the door itself.
		//
		// killough 9/9/98: If a line blocking the monster is activated,
		// return true 90% of the time. If a line blocking the monster is
		// not activated, but some other line is, return false 90% of the
		// time. A bit of randomness is needed to ensure it's free from
		// lockups, but for most cases, it returns the correct result.
		//
		// Do NOT simply return false 1/4th of the time (causes monsters to
		// back out when they shouldn't, and creates secondary stickiness).

		spechit_t spec;
		int good = 0;
		
		if (!(actor->flags6 & MF6_NOTRIGGER))
		{
			while (spechit.Pop (spec))
			{
				// [RH] let monsters push lines, as well as use them
				if (((actor->flags4 & MF4_CANUSEWALLS) && P_ActivateLine (spec.line, actor, 0, SPAC_Use)) ||
					((actor->flags2 & MF2_PUSHWALL) && P_ActivateLine (spec.line, actor, 0, SPAC_Push)))
				{
					good |= spec.line == actor->BlockingLine ? 1 : 2;
				}
			}
		}
		else spechit.Clear();
		return good && ((pr_opendoor() >= 203) ^ (good & 1));
	}
	else
	{
		actor->flags &= ~MF_INFLOAT;
	}
	return true; 
}